

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

Export * __thiscall
wasm::Module::addExport
          (Module *this,unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr)

{
  Export *pEVar1;
  string local_40;
  _Head_base<0UL,_wasm::Export_*,_false> local_20;
  
  local_20._M_head_impl =
       (curr->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = (Export *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addExport","");
  pEVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>,std::unordered_map<wasm::Name,wasm::Export*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Export*>>>,wasm::Export>
                     (&this->exports,&this->exportsMap,
                      (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_20,
                      &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20._M_head_impl != (Export *)0x0) {
    operator_delete(local_20._M_head_impl,0x28);
  }
  return pEVar1;
}

Assistant:

Export* Module::addExport(std::unique_ptr<Export>&& curr) {
  return addModuleElement(exports, exportsMap, std::move(curr), "addExport");
}